

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tushort
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  short sVar1;
  long local_78;
  long ii;
  int *idata;
  int flagval;
  short *sbuff;
  unsigned_short *usbuff;
  double zero_local;
  double scale_local;
  int nullval_local;
  void *nullflagval_local;
  int nullcheck_local;
  long tilelen_local;
  void *tiledata_local;
  fitsfile *outfptr_local;
  
  if ((((zbitpix != 0x10) || (scale != 1.0)) || (NAN(scale))) || ((zero != 32768.0 || (NAN(zero)))))
  {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    outfptr_local._4_4_ = 0x19d;
  }
  else {
    if (((outfptr->Fptr->compress_type == 0xb) || (outfptr->Fptr->compress_type == 0x15)) ||
       ((outfptr->Fptr->compress_type == 0x16 || (outfptr->Fptr->compress_type == 0x33)))) {
      *intlength = 2;
      if (nullcheck == 1) {
        sVar1 = *nullflagval;
        for (local_78 = tilelen + -1; -1 < local_78; local_78 = local_78 + -1) {
          if (*(short *)((long)tiledata + local_78 * 2) == sVar1) {
            *(short *)((long)tiledata + local_78 * 2) = (short)nullval;
          }
          else {
            *(ushort *)((long)tiledata + local_78 * 2) =
                 *(ushort *)((long)tiledata + local_78 * 2) ^ 0x8000;
          }
        }
      }
      else {
        for (local_78 = tilelen + -1; -1 < local_78; local_78 = local_78 + -1) {
          *(ushort *)((long)tiledata + local_78 * 2) =
               *(ushort *)((long)tiledata + local_78 * 2) ^ 0x8000;
        }
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        sVar1 = *nullflagval;
        for (local_78 = tilelen + -1; -1 < local_78; local_78 = local_78 + -1) {
          if (*(short *)((long)tiledata + local_78 * 2) == sVar1) {
            *(int *)((long)tiledata + local_78 * 4) = nullval;
          }
          else {
            *(uint *)((long)tiledata + local_78 * 4) =
                 *(ushort *)((long)tiledata + local_78 * 2) - 0x8000;
          }
        }
      }
      else if (outfptr->Fptr->compress_type == 0x29) {
        fits_ushort_to_int_inplace((unsigned_short *)tiledata,tilelen,-0x8000,status);
      }
      else {
        fits_ushort_to_int_inplace((unsigned_short *)tiledata,tilelen,0,status);
      }
    }
    outfptr_local._4_4_ = *status;
  }
  return outfptr_local._4_4_;
}

Assistant:

int imcomp_convert_tile_tushort(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input  tile array of pixels for compression. */
    /*  Convert input unsigned integer*2 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    unsigned short *usbuff;
    short *sbuff;
    int flagval, *idata;
    long ii;
    
       /* datatype of input array is unsigned short.  We only support writing this datatype
          to a FITS image with BITPIX = 16 and with BZERO = 0 and BSCALE = 32768.  */

       if (zbitpix != SHORT_IMG || scale != 1.0 || zero != 32768.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       usbuff = (unsigned short *) tiledata;
       sbuff = (short *) tiledata;
       idata = (int *) tiledata;

       if ((outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
        || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1) 
       {
           /* don't have to convert to int if using gzip, bzip2, or Rice compression */
           *intlength = 2;

          /* offset the unsigned value by -32768 to a signed short value. */
	  /* It is more efficient to do this by just flipping the most significant of the 16 bits */

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression  */
               flagval = *(unsigned short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbuff[ii] == (unsigned short) flagval)
		       sbuff[ii] = (short) nullval;
                    else
		       usbuff[ii] =  (usbuff[ii]) ^ 0x8000;
               }
           } else {
               /* just offset the pixel values by 32768 (by flipping the MSB */
               for (ii = tilelen - 1; ii >= 0; ii--)
		       usbuff[ii] =  (usbuff[ii]) ^ 0x8000;
           }
       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* offset the pixel values by 32768, and */
               /* reset pixels equal to flagval to nullval */
               flagval = *(unsigned short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbuff[ii] == (unsigned short) flagval)
		       idata[ii] = nullval;
                    else
		       idata[ii] = ((int) usbuff[ii]) - 32768;
               }
           } else {  /* just do the data type conversion to int */
               /* for HCOMPRESS we need to simply subtract 32768 */
               /* for PLIO, have to convert usbuff to an I*4 array, in place */
               /* usbuff must have been allocated large enough to do this */

               if ((outfptr->Fptr)->compress_type == HCOMPRESS_1) {
                    fits_ushort_to_int_inplace(usbuff, tilelen, -32768, status);
               } else {
                    fits_ushort_to_int_inplace(usbuff, tilelen, 0, status);
               }
           }
        }

        return(*status);
}